

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O0

void __thiscall
TPZSkylMatrix<std::complex<float>_>::DecomposeColumn
          (TPZSkylMatrix<std::complex<float>_> *this,int64_t col,int64_t prevcol)

{
  int64_t iVar1;
  int64_t iVar2;
  complex<float> *pcVar3;
  complex<float> *pcVar4;
  long in_RDX;
  long in_RSI;
  TPZSkylMatrix<std::complex<float>_> *in_RDI;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  complex<float> sum;
  complex<float> *run2;
  complex<float> *run1;
  int64_t minline;
  int64_t skcol;
  int64_t skprev;
  complex<float> *ptrcol;
  complex<float> *ptrprev;
  complex<float> *in_stack_ffffffffffffff88;
  complex<float> *in_stack_ffffffffffffff98;
  TPZSkylMatrix<std::complex<float>_> *in_stack_ffffffffffffffa0;
  complex<float> in_stack_ffffffffffffffa8;
  complex<float> *local_48;
  long local_40;
  
  iVar1 = SkyHeight(in_stack_ffffffffffffffa0,(int64_t)in_stack_ffffffffffffff98);
  iVar2 = SkyHeight(in_stack_ffffffffffffffa0,(int64_t)in_stack_ffffffffffffff98);
  pcVar3 = Diag(in_RDI,(int64_t)in_stack_ffffffffffffff88);
  pcVar4 = Diag(in_RDI,(int64_t)in_stack_ffffffffffffff88);
  if (in_RSI - iVar2 < in_RDX - iVar1) {
    local_40 = in_RDX - iVar1;
  }
  else {
    local_40 = in_RSI - iVar2;
  }
  if (in_RDX < local_40) {
    std::operator<<((ostream *)&std::cout,"error condition\n");
    std::ostream::flush();
  }
  else {
    local_48 = pcVar3 + (in_RDX - local_40);
    pcVar4 = pcVar4 + (in_RSI - local_40);
    std::complex<float>::complex((complex<float> *)&stack0xffffffffffffffa8,0.0,0.0);
    while (local_48 != pcVar3) {
      local_48 = local_48 + -1;
      pcVar4 = pcVar4 + -1;
      std::operator*(in_stack_ffffffffffffff88,(complex<float> *)0x13713ba);
      in_stack_ffffffffffffffa0 =
           (TPZSkylMatrix<std::complex<float>_> *)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
      std::complex<float>::operator+=
                ((complex<float> *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    }
    std::complex<float>::operator-=
              ((complex<float> *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    if (local_48 == pcVar4) {
      std::sqrt<float>((complex<float> *)in_stack_ffffffffffffffa8._M_value);
      pcVar4->_M_value = CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00);
    }
    else {
      std::complex<float>::operator/=(pcVar4,(complex<float> *)in_stack_ffffffffffffffa8._M_value);
    }
  }
  return;
}

Assistant:

void TPZSkylMatrix<TVar>::DecomposeColumn(int64_t col, int64_t prevcol){
    TVar *ptrprev;     //Pointer to prev column
    TVar *ptrcol;      //Pointer to col column
    int64_t skprev, skcol; //prev and col Skyline height respectively
    int64_t minline;
    
    skprev = SkyHeight(prevcol);
    skcol = SkyHeight(col);
    
    ptrprev = Diag(prevcol);
    ptrcol = Diag(col);
    
    if((prevcol-skprev) > (col-skcol)){
        minline = prevcol - skprev;
    }else
    {
        minline = col - skcol;
    }
    if(minline > prevcol) {
        cout << "error condition\n";
        cout.flush();
        return;
    }
    TVar *run1 = ptrprev + (prevcol-minline);
    TVar *run2 = ptrcol + (col-minline);
    TVar sum = 0;
    
    while(run1 != ptrprev) sum += (*run1--)*(*run2--);
    *run2-=sum;
    if(run1 != run2){
        *run2 /= *run1;
    }else{
        *run2=sqrt(*run2);
    }
    
}